

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSpinBarrier.cpp
# Opt level: O0

void de::SpinBarrier_selfTest(void)

{
  anon_unknown_0::singleThreadTest(WAIT_MODE_YIELD);
  anon_unknown_0::singleThreadTest(WAIT_MODE_BUSY);
  anon_unknown_0::singleThreadTest(WAIT_MODE_AUTO);
  anon_unknown_0::multiThreadTest(1);
  anon_unknown_0::multiThreadTest(2);
  anon_unknown_0::multiThreadTest(4);
  anon_unknown_0::multiThreadTest(8);
  anon_unknown_0::multiThreadTest(0x10);
  anon_unknown_0::singleThreadRemoveTest(WAIT_MODE_YIELD);
  anon_unknown_0::singleThreadRemoveTest(WAIT_MODE_BUSY);
  anon_unknown_0::singleThreadRemoveTest(WAIT_MODE_AUTO);
  anon_unknown_0::multiThreadRemoveTest(1,WAIT_MODE_BUSY);
  anon_unknown_0::multiThreadRemoveTest(2,WAIT_MODE_AUTO);
  anon_unknown_0::multiThreadRemoveTest(4,WAIT_MODE_AUTO);
  anon_unknown_0::multiThreadRemoveTest(8,WAIT_MODE_AUTO);
  anon_unknown_0::multiThreadRemoveTest(0x10,WAIT_MODE_AUTO);
  anon_unknown_0::multiThreadRemoveTest(1,WAIT_MODE_YIELD);
  anon_unknown_0::multiThreadRemoveTest(2,WAIT_MODE_YIELD);
  anon_unknown_0::multiThreadRemoveTest(4,WAIT_MODE_YIELD);
  anon_unknown_0::multiThreadRemoveTest(8,WAIT_MODE_YIELD);
  anon_unknown_0::multiThreadRemoveTest(0x10,WAIT_MODE_YIELD);
  return;
}

Assistant:

void SpinBarrier_selfTest (void)
{
	singleThreadTest(SpinBarrier::WAIT_MODE_YIELD);
	singleThreadTest(SpinBarrier::WAIT_MODE_BUSY);
	singleThreadTest(SpinBarrier::WAIT_MODE_AUTO);
	multiThreadTest(1);
	multiThreadTest(2);
	multiThreadTest(4);
	multiThreadTest(8);
	multiThreadTest(16);

	singleThreadRemoveTest(SpinBarrier::WAIT_MODE_YIELD);
	singleThreadRemoveTest(SpinBarrier::WAIT_MODE_BUSY);
	singleThreadRemoveTest(SpinBarrier::WAIT_MODE_AUTO);
	multiThreadRemoveTest(1, SpinBarrier::WAIT_MODE_BUSY);
	multiThreadRemoveTest(2, SpinBarrier::WAIT_MODE_AUTO);
	multiThreadRemoveTest(4, SpinBarrier::WAIT_MODE_AUTO);
	multiThreadRemoveTest(8, SpinBarrier::WAIT_MODE_AUTO);
	multiThreadRemoveTest(16, SpinBarrier::WAIT_MODE_AUTO);
	multiThreadRemoveTest(1, SpinBarrier::WAIT_MODE_YIELD);
	multiThreadRemoveTest(2, SpinBarrier::WAIT_MODE_YIELD);
	multiThreadRemoveTest(4, SpinBarrier::WAIT_MODE_YIELD);
	multiThreadRemoveTest(8, SpinBarrier::WAIT_MODE_YIELD);
	multiThreadRemoveTest(16, SpinBarrier::WAIT_MODE_YIELD);
}